

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format.c
# Opt level: O1

int archive_write_set_format(archive *a,int code)

{
  long lVar1;
  int iVar2;
  anon_struct_16_2_51f16b0b *paVar3;
  long lVar4;
  
  if (code == 0xe0000) {
    paVar3 = codes;
  }
  else {
    lVar1 = 0;
    do {
      lVar4 = lVar1;
      if (lVar4 + 0x10 == 0x140) {
        archive_set_error(a,0x16,"No such format");
        return -0x1e;
      }
      lVar1 = lVar4 + 0x10;
    } while (*(int *)((long)&codes[1].code + lVar4) != code);
    paVar3 = (anon_struct_16_2_51f16b0b *)(lVar4 + 0xa635d0);
  }
  iVar2 = (*paVar3->setter)(a);
  return iVar2;
}

Assistant:

int
archive_write_set_format(struct archive *a, int code)
{
	int i;

	for (i = 0; codes[i].code != 0; i++) {
		if (code == codes[i].code)
			return ((codes[i].setter)(a));
	}

	archive_set_error(a, EINVAL, "No such format");
	return (ARCHIVE_FATAL);
}